

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WrittenFontTrueType.cpp
# Opt level: O1

bool __thiscall
WrittenFontTrueType::AddToANSIRepresentation
          (WrittenFontTrueType *this,GlyphUnicodeMappingListList *inGlyphsList,
          UShortListList *outEncodedCharacters)

{
  _Rb_tree_header *p_Var1;
  unsigned_short inEncodedCharacter;
  WrittenFontRepresentation *pWVar2;
  bool bVar3;
  _Node *p_Var4;
  _Rb_tree_color _Var5;
  _List_node_base *p_Var6;
  _Base_ptr p_Var7;
  _List_node_base *p_Var8;
  _Base_ptr p_Var9;
  _List_node_base *p_Var10;
  bool bVar11;
  UShortList candidates;
  UShortListList candidatesList;
  GlyphEncodingInfo local_e8;
  _List_node_base *local_c8;
  _List_node_base *local_c0;
  _List_node_base local_b8;
  undefined8 local_a8;
  list<std::__cxx11::list<unsigned_short,std::allocator<unsigned_short>>,std::allocator<std::__cxx11::list<unsigned_short,std::allocator<unsigned_short>>>>
  *local_a0;
  WrittenFontTrueType *local_98;
  pair<const_unsigned_int,_GlyphEncodingInfo> local_90;
  _List_base<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  local_68;
  _List_node_base *local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  local_c8 = (_List_node_base *)&local_68;
  local_68._M_impl._M_node._M_size = 0;
  local_a8 = 0;
  p_Var6 = (inGlyphsList->
           super__List_base<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>,_std::allocator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  local_c0 = (_List_node_base *)inGlyphsList;
  local_b8._M_next = &local_b8;
  local_b8._M_prev = &local_b8;
  local_a0 = (list<std::__cxx11::list<unsigned_short,std::allocator<unsigned_short>>,std::allocator<std::__cxx11::list<unsigned_short,std::allocator<unsigned_short>>>>
              *)outEncodedCharacters;
  local_98 = this;
  local_68._M_impl._M_node.super__List_node_base._M_next = local_c8;
  local_68._M_impl._M_node.super__List_node_base._M_prev = local_c8;
  if (p_Var6 == (_List_node_base *)inGlyphsList) {
    bVar3 = true;
  }
  else {
    do {
      bVar3 = AddANSICandidates(this,(GlyphUnicodeMappingList *)(p_Var6 + 1),(UShortList *)&local_b8
                               );
      if (bVar3) {
        p_Var4 = std::__cxx11::
                 list<std::__cxx11::list<unsigned_short,std::allocator<unsigned_short>>,std::allocator<std::__cxx11::list<unsigned_short,std::allocator<unsigned_short>>>>
                 ::
                 _M_create_node<std::__cxx11::list<unsigned_short,std::allocator<unsigned_short>>const&>
                           ((list<std::__cxx11::list<unsigned_short,std::allocator<unsigned_short>>,std::allocator<std::__cxx11::list<unsigned_short,std::allocator<unsigned_short>>>>
                             *)&local_68,
                            (list<unsigned_short,_std::allocator<unsigned_short>_> *)&local_b8);
        std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
        local_68._M_impl._M_node._M_size = local_68._M_impl._M_node._M_size + 1;
        p_Var8 = local_b8._M_next;
        this = local_98;
        while (local_98 = this, p_Var8 != &local_b8) {
          p_Var10 = (((_List_base<unsigned_short,_std::allocator<unsigned_short>_> *)
                     &p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
          operator_delete(p_Var8,0x18);
          p_Var8 = p_Var10;
          this = local_98;
        }
        local_a8 = 0;
        local_b8._M_next = &local_b8;
        local_b8._M_prev = &local_b8;
      }
      p_Var6 = (((_List_base<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>,_std::allocator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>
                  *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (bVar3 && p_Var6 != local_c0);
  }
  if (bVar3 != false) {
    pWVar2 = (this->super_AbstractWrittenFont).mANSIRepresentation;
    if ((pWVar2->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      GlyphEncodingInfo::GlyphEncodingInfo(&local_e8,0,0);
      local_90.first = 0;
      local_90.second.mEncodedCharacter = local_e8.mEncodedCharacter;
      local_90.second.mUnicodeCharacters.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_e8.mUnicodeCharacters.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_90.second.mUnicodeCharacters.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_e8.mUnicodeCharacters.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_90.second.mUnicodeCharacters.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_e8.mUnicodeCharacters.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_e8.mUnicodeCharacters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8.mUnicodeCharacters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_e8.mUnicodeCharacters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,GlyphEncodingInfo>,std::_Select1st<std::pair<unsigned_int_const,GlyphEncodingInfo>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,GlyphEncodingInfo>>>
      ::_M_insert_unique<std::pair<unsigned_int_const,GlyphEncodingInfo>>
                ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,GlyphEncodingInfo>,std::_Select1st<std::pair<unsigned_int_const,GlyphEncodingInfo>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,GlyphEncodingInfo>>>
                  *)pWVar2,&local_90);
      if (local_90.second.mUnicodeCharacters.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.second.mUnicodeCharacters.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_90.second.mUnicodeCharacters.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_90.second.mUnicodeCharacters.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_e8.mUnicodeCharacters.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e8.mUnicodeCharacters.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_e8.mUnicodeCharacters.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_e8.mUnicodeCharacters.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    p_Var6 = local_c0->_M_next;
    if (p_Var6 != local_c0) {
      do {
        local_c8 = (((_List_impl *)&local_c8->_M_next)->_M_node).super__List_node_base._M_next;
        p_Var8 = p_Var6[1]._M_next;
        local_50 = p_Var6;
        if (p_Var8 != p_Var6 + 1) {
          p_Var10 = local_c8 + 1;
          do {
            pWVar2 = (this->super_AbstractWrittenFont).mANSIRepresentation;
            p_Var1 = &(pWVar2->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header;
            _Var5 = (_Rb_tree_color)*(ushort *)((long)(p_Var8 + 2) + 8);
            p_Var9 = (pWVar2->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_parent;
            p_Var7 = &p_Var1->_M_header;
            for (; p_Var9 != (_Base_ptr)0x0; p_Var9 = (&p_Var9->_M_left)[bVar11]) {
              bVar11 = p_Var9[1]._M_color < _Var5;
              if (!bVar11) {
                p_Var7 = p_Var9;
              }
            }
            p_Var9 = &p_Var1->_M_header;
            if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
               (p_Var9 = p_Var7, _Var5 < p_Var7[1]._M_color)) {
              p_Var9 = &p_Var1->_M_header;
            }
            p_Var10 = p_Var10->_M_next;
            if ((_Rb_tree_header *)p_Var9 == p_Var1) {
              inEncodedCharacter = *(unsigned_short *)&p_Var10[1]._M_next;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        (&local_48,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(p_Var8 + 1));
              GlyphEncodingInfo::GlyphEncodingInfo(&local_e8,inEncodedCharacter,&local_48);
              local_90.first = (uint)*(ushort *)((long)(p_Var8 + 2) + 8);
              local_90.second.mEncodedCharacter = local_e8.mEncodedCharacter;
              local_90.second.mUnicodeCharacters.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start =
                   local_e8.mUnicodeCharacters.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_90.second.mUnicodeCharacters.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_e8.mUnicodeCharacters.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              local_90.second.mUnicodeCharacters.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   local_e8.mUnicodeCharacters.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              local_e8.mUnicodeCharacters.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_e8.mUnicodeCharacters.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_e8.mUnicodeCharacters.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::
              _Rb_tree<unsigned_int,std::pair<unsigned_int_const,GlyphEncodingInfo>,std::_Select1st<std::pair<unsigned_int_const,GlyphEncodingInfo>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,GlyphEncodingInfo>>>
              ::_M_insert_unique<std::pair<unsigned_int_const,GlyphEncodingInfo>>
                        ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,GlyphEncodingInfo>,std::_Select1st<std::pair<unsigned_int_const,GlyphEncodingInfo>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,GlyphEncodingInfo>>>
                          *)pWVar2,&local_90);
              if (local_90.second.mUnicodeCharacters.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_90.second.mUnicodeCharacters.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_90.second.mUnicodeCharacters.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_90.second.mUnicodeCharacters.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_e8.mUnicodeCharacters.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_e8.mUnicodeCharacters.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_e8.mUnicodeCharacters.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_e8.mUnicodeCharacters.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              this = local_98;
              if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_48.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_48.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_48.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                this = local_98;
              }
            }
            p_Var8 = p_Var8->_M_next;
          } while (p_Var8 != p_Var6 + 1);
        }
        p_Var6 = local_50->_M_next;
      } while (p_Var6 != local_c0);
    }
    if ((list<std::__cxx11::list<unsigned_short,std::allocator<unsigned_short>>,std::allocator<std::__cxx11::list<unsigned_short,std::allocator<unsigned_short>>>>
         *)&local_68 != local_a0) {
      std::__cxx11::
      list<std::__cxx11::list<unsigned_short,std::allocator<unsigned_short>>,std::allocator<std::__cxx11::list<unsigned_short,std::allocator<unsigned_short>>>>
      ::
      _M_assign_dispatch<std::_List_const_iterator<std::__cxx11::list<unsigned_short,std::allocator<unsigned_short>>>>
                (local_a0,local_68._M_impl._M_node.super__List_node_base._M_next);
    }
  }
  p_Var6 = local_b8._M_next;
  while (p_Var6 != &local_b8) {
    p_Var8 = p_Var6->_M_next;
    operator_delete(p_Var6,0x18);
    p_Var6 = p_Var8;
  }
  std::__cxx11::
  _List_base<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::_M_clear(&local_68);
  return bVar3;
}

Assistant:

bool WrittenFontTrueType::AddToANSIRepresentation(	const GlyphUnicodeMappingListList& inGlyphsList,
													UShortListList& outEncodedCharacters)
{
	UShortListList candidatesList;
	UShortList candidates;
	BoolAndByte encodingResult(true,0);
	GlyphUnicodeMappingListList::const_iterator itList = inGlyphsList.begin(); 
	bool result = true;

	for(; itList != inGlyphsList.end() && result; ++itList)
	{
		result = AddANSICandidates(*itList, candidates);
		if(result)
		{
			candidatesList.push_back(candidates);
			candidates.clear();
		}
	}

	if(result)
	{
		// for the first time, add also 0,0 mapping
		if(mANSIRepresentation->mGlyphIDToEncodedChar.size() == 0)
			mANSIRepresentation->mGlyphIDToEncodedChar.insert(UIntToGlyphEncodingInfoMap::value_type(0,GlyphEncodingInfo(0,0)));


		GlyphUnicodeMappingListList::const_iterator itGlyphsList = inGlyphsList.begin();
		UShortListList::iterator itEncodedList = candidatesList.begin();
		GlyphUnicodeMappingList::const_iterator itGlyphs;
		UShortList::iterator itEncoded;

		for(; itGlyphsList != inGlyphsList.end(); ++ itGlyphsList,++itEncodedList)
		{
			itGlyphs = itGlyphsList->begin();
			itEncoded = itEncodedList->begin();
			for(; itGlyphs != itGlyphsList->end(); ++ itGlyphs,++itEncoded)
			{
				if(mANSIRepresentation->mGlyphIDToEncodedChar.find(itGlyphs->mGlyphCode) == mANSIRepresentation->mGlyphIDToEncodedChar.end())
					mANSIRepresentation->mGlyphIDToEncodedChar.insert(
					UIntToGlyphEncodingInfoMap::value_type(itGlyphs->mGlyphCode,GlyphEncodingInfo(*itEncoded,itGlyphs->mUnicodeValues)));
			}
		}

		outEncodedCharacters = candidatesList;
	}

	return result;	
}